

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oid.c
# Opt level: O2

bool_t oidIsValid(char *oid)

{
  byte bVar1;
  bool_t bVar2;
  uint uVar3;
  ulong uVar4;
  long lVar5;
  uint uVar6;
  ulong uVar7;
  
  bVar2 = strIsValid(oid);
  if (bVar2 == 0) {
    uVar3 = 0;
  }
  else {
    uVar3 = 0;
    uVar4 = 0;
    while( true ) {
      uVar6 = 0;
      for (lVar5 = 0; (bVar1 = oid[lVar5], bVar1 != 0x2e && (bVar1 != 0)); lVar5 = lVar5 + 1) {
        if ((byte)(bVar1 - 0x3a) < 0xf6) {
          return 0;
        }
        if ((lVar5 == 1) && (*oid == '0')) {
          return 0;
        }
        if (0x19999999 < uVar6) {
          return 0;
        }
        if (uVar6 == 0x19999999 && bVar1 - 0x36 < 0xfffffffa) {
          return 0;
        }
        uVar6 = (uVar6 * 10 + (uint)bVar1) - 0x30;
      }
      if ((lVar5 == 0) ||
         ((((uVar4 == 0 && (2 < uVar6)) || ((uVar3 < 2 && uVar4 == 1) && 0x27 < uVar6)) ||
          ((uVar4 == 1 && (uVar3 * -0x28 - 1 < uVar6)))))) break;
      uVar7 = uVar4 + 1;
      if (bVar1 == 0) goto LAB_0010ef58;
      if (uVar4 == 0) {
        uVar3 = uVar6;
      }
      oid = oid + lVar5 + 1;
      uVar4 = uVar7;
    }
    uVar7 = 0;
LAB_0010ef58:
    uVar3 = (uint)(1 < uVar7);
  }
  return uVar3;
}

Assistant:

bool_t oidIsValid(const char* oid)
{
	u32 val = 0;
	u32 d1 = 0;
	size_t pos = 0;
	size_t n = 0;
	// pre
	if (!strIsValid(oid))
		return FALSE;
	// цикл по символам oid
	while (1)
	{
		// закончили очередное число?
		if (oid[pos] == '.' || oid[pos] == '\0')
		{
			// пустое число? d1 > 2? d1 < 2 && d2 >= 40?
			// 40 * d1 + d2 не укладывается в u32?
			if (pos == 0 ||
				n == 0 && val > 2 ||
				n == 1 && d1 < 2 && val >= 40 ||
				n == 1 && val > U32_MAX - 40 * d1)
			{
				n = 0;
				break;
			}
			// сохранить d1
			if (n == 0)
				d1 = val;
			// закончить обработку
			n++;
			// конец строки?
			if (oid[pos] == '\0')
				break;
			// к следующему числу (пропустить .)
			oid += ++pos, pos = 0, val = 0;
			continue;
		}
		// недопустимый символ? лидирующий 0? переполнение?
		if (oid[pos] < '0' || oid[pos] > '9' ||
			pos == 1 && oid[0] == '0' ||
			val > U32_MAX / 10 ||
			val == U32_MAX / 10 && (u32)(oid[pos] - '0') > U32_MAX % 10)
		{
			n = 0;
			break;
		}
		// обработать цифру
		val *= 10;
		val += oid[pos] - '0';
		++pos;
	}
	// очистка и выход
	val = d1 = 0, pos = 0;
	return n >= 2;
}